

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_rollback_hook(sqlite3 *db,_func_void_void_ptr *xCallback,void *pArg)

{
  void *pvVar1;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    pvVar1 = db->pRollbackArg;
    db->xRollbackCallback = xCallback;
    db->pRollbackArg = pArg;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    pvVar1 = db->pRollbackArg;
    db->xRollbackCallback = xCallback;
    db->pRollbackArg = pArg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_rollback_hook(
  sqlite3 *db,              /* Attach the hook to this database */
  void (*xCallback)(void*), /* Callback function */
  void *pArg                /* Argument to the function */
){
  void *pRet;
  sqlite3_mutex_enter(db->mutex);
  pRet = db->pRollbackArg;
  db->xRollbackCallback = xCallback;
  db->pRollbackArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pRet;
}